

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O3

string * ListQt5RccInputs(string *__return_storage_ptr__,cmSourceFile *sf,cmGeneratorTarget *target,
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *depends)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  string *psVar7;
  istream *piVar8;
  ostream *poVar9;
  string *extraout_RAX;
  char *__s;
  string oline;
  string rccStdOut;
  string absFile;
  int retVal;
  string rccStdErr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  qrcEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string rccCommand;
  string rccStdOut_1;
  string local_2c8;
  undefined1 local_2a8 [32];
  string *local_288;
  string local_280;
  int local_25c;
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1d8;
  undefined1 local_1d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  local_288 = __return_storage_ptr__;
  local_1d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)depends;
  GetRccExecutable_abi_cxx11_((string *)local_1d0,target);
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = (pointer)0x0;
  local_2a8._16_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2a8,(string *)local_1d0);
  local_1b0._M_allocated_capacity = (size_type)local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"--help","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_allocated_capacity != local_1a0) {
    operator_delete((void *)local_1b0._M_allocated_capacity,
                    CONCAT71(local_1a0[0]._M_allocated_capacity._1_7_,local_1a0[0]._M_local_buf[0])
                    + 1);
  }
  local_1b0._8_8_ = 0;
  local_1a0[0]._M_local_buf[0] = '\0';
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_258._M_dataplus._M_p = (pointer)((ulong)local_258._M_dataplus._M_p._4_4_ << 0x20);
  local_1b0._M_allocated_capacity = (size_type)local_1a0;
  bVar2 = cmSystemTools::RunSingleCommand
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2a8,(string *)&local_1b0,&local_280,(int *)&local_258,(char *)0x0,
                     OUTPUT_NONE,0.0);
  if (bVar2 && (int)local_258._M_dataplus._M_p == 0) {
    lVar5 = std::__cxx11::string::find(local_1b0._M_local_buf,0x5a9c49,0);
    __s = "-list";
    if (lVar5 != -1) {
      __s = "--list";
    }
  }
  else {
    __s = "-list";
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_allocated_capacity != local_1a0) {
    operator_delete((void *)local_1b0._M_allocated_capacity,
                    CONCAT71(local_1a0[0]._M_allocated_capacity._1_7_,local_1a0[0]._M_local_buf[0])
                    + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a8);
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1f8,(value_type *)local_1d0);
  local_1b0._M_allocated_capacity = (size_type)local_1a0;
  sVar6 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,__s,__s + sVar6);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_allocated_capacity != local_1a0) {
    operator_delete((void *)local_1b0._M_allocated_capacity,
                    CONCAT71(local_1a0[0]._M_allocated_capacity._1_7_,local_1a0[0]._M_local_buf[0])
                    + 1);
  }
  psVar7 = cmSourceFile::GetFullPath(sf,(string *)0x0);
  cmsys::SystemTools::GetRealPath(&local_280,psVar7,(string *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1f8,&local_280);
  local_2a8._0_8_ = local_2a8 + 0x10;
  local_2a8._8_8_ = (pointer)0x0;
  local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_25c = 0;
  bVar2 = cmSystemTools::RunSingleCommand
                    (&local_1f8,(string *)local_2a8,&local_258,&local_25c,(char *)0x0,OUTPUT_NONE,
                     0.0);
  if (bVar2 && local_25c == 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0._M_local_buf,(string *)local_2a8,_S_in);
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_218.field_2;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0._M_allocated_capacity - 0x18) +
                              (char)&local_1b0);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0._M_local_buf,(string *)&local_2c8,cVar3);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      cmQtAutoGeneratorsStripCR(&local_218,&local_2c8);
      std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_238,&local_2c8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                               local_2c8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0._M_local_buf);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0._M_local_buf,(string *)&local_258,_S_in);
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0._M_allocated_capacity - 0x18) +
                              (char)&local_1b0);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0._M_local_buf,(string *)&local_2c8,cVar3);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      cmQtAutoGeneratorsStripCR(&local_218,&local_2c8);
      std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      iVar4 = strncmp(local_2c8._M_dataplus._M_p,"RCC: Error in",0xd);
      if (iVar4 == 0) {
        if ((ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
             ::searchString_abi_cxx11_ == '\0') &&
           (iVar4 = __cxa_guard_acquire(&ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                         ::searchString_abi_cxx11_), iVar4 != 0)) {
          ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::searchString_abi_cxx11_._M_dataplus._M_p =
               (pointer)&ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                         ::searchString_abi_cxx11_.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                      ::searchString_abi_cxx11_,"Cannot find file \'","");
          __cxa_atexit(std::__cxx11::string::~string,
                       &ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                        ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::searchString_abi_cxx11_);
        }
        lVar5 = std::__cxx11::string::find
                          ((char *)&local_2c8,
                           (ulong)ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                  ::searchString_abi_cxx11_._M_dataplus._M_p,0);
        if (lVar5 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"AUTOGEN: error: Rcc lists unparsable output ",0x2c);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_2c8._M_dataplus._M_p,
                              local_2c8._M_string_length);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          (local_288->_M_dataplus)._M_p = (pointer)&local_288->field_2;
          local_288->_M_string_length = 0;
          (local_288->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,
                            CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                                     local_2c8.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0._M_local_buf);
          std::ios_base::~ios_base(local_138);
          goto LAB_00342df4;
        }
        std::__cxx11::string::substr((ulong)&local_218,(ulong)&local_2c8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
                   &local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar1) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                               local_2c8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0._M_local_buf);
    std::ios_base::~ios_base(local_138);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_1d8,*(undefined8 *)(local_1d8 + 8),
               local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (local_288,&local_238,"@list_sep@");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AUTOGEN: error: Rcc list process for ",0x25);
    psVar7 = cmSourceFile::GetFullPath(sf,(string *)0x0);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," failed:\n",9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)local_2a8._0_8_,local_2a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    (local_288->_M_dataplus)._M_p = (pointer)&local_288->field_2;
    local_288->_M_string_length = 0;
    (local_288->field_2)._M_local_buf[0] = '\0';
  }
LAB_00342df4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  psVar7 = (string *)(local_1d0 + 0x10);
  if ((string *)local_1d0._0_8_ != psVar7) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    psVar7 = extraout_RAX;
  }
  return psVar7;
}

Assistant:

static std::string ListQt5RccInputs(cmSourceFile* sf,
                                            cmGeneratorTarget const* target,
                                            std::vector<std::string>& depends)
{
  std::string rccCommand
      = GetRccExecutable(target);

  bool hasDashDashList = false;
  {
  std::vector<std::string> command;
  command.push_back(rccCommand);
  command.push_back("--help");
  std::string rccStdOut;
  std::string rccStdErr;
  int retVal = 0;
  bool result = cmSystemTools::RunSingleCommand(
    command, &rccStdOut, &rccStdErr,
    &retVal, 0, cmSystemTools::OUTPUT_NONE);
  if (result && retVal == 0 &&
      rccStdOut.find("--list") != std::string::npos)
    {
    hasDashDashList = true;
    }
  }

  std::vector<std::string> qrcEntries;

  std::vector<std::string> command;
  command.push_back(rccCommand);
  command.push_back(hasDashDashList? "--list" : "-list");

  std::string absFile = cmsys::SystemTools::GetRealPath(
                                              sf->GetFullPath());

  command.push_back(absFile);

  std::string rccStdOut;
  std::string rccStdErr;
  int retVal = 0;
  bool result = cmSystemTools::RunSingleCommand(
    command, &rccStdOut, &rccStdErr,
    &retVal, 0, cmSystemTools::OUTPUT_NONE);
  if (!result || retVal)
    {
    std::cerr << "AUTOGEN: error: Rcc list process for " << sf->GetFullPath()
              << " failed:\n" << rccStdOut << "\n" << rccStdErr << std::endl;
    return std::string();
    }

  {
  std::istringstream ostr(rccStdOut);
  std::string oline;
  while(std::getline(ostr, oline))
    {
    oline = cmQtAutoGeneratorsStripCR(oline);
    if(!oline.empty())
      {
      qrcEntries.push_back(oline);
      }
    }
  }

  {
  std::istringstream estr(rccStdErr);
  std::string eline;
  while(std::getline(estr, eline))
    {
    eline = cmQtAutoGeneratorsStripCR(eline);
    if (cmHasLiteralPrefix(eline, "RCC: Error in"))
      {
      static std::string searchString = "Cannot find file '";

      std::string::size_type pos = eline.find(searchString);
      if (pos == std::string::npos)
        {
        std::cerr << "AUTOGEN: error: Rcc lists unparsable output "
                  << eline << std::endl;
        return std::string();
        }
      pos += searchString.length();
      std::string::size_type sz = eline.size() - pos - 1;
      qrcEntries.push_back(eline.substr(pos, sz));
      }
    }
  }

  depends.insert(depends.end(), qrcEntries.begin(), qrcEntries.end());
  return cmJoin(qrcEntries, "@list_sep@");
}